

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgfmt.cpp
# Opt level: O0

Format * __thiscall
icu_63::MessageFormat::getCachedFormatter(MessageFormat *this,int32_t argumentNumber)

{
  Format *pFVar1;
  long local_40;
  void *ptr;
  int32_t argumentNumber_local;
  MessageFormat *this_local;
  
  if ((this->cachedFormatters != (UHashtable *)0x0) &&
     (pFVar1 = (Format *)uhash_iget_63(this->cachedFormatters,argumentNumber),
     pFVar1 != (Format *)0x0)) {
    if (pFVar1 == (Format *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = __dynamic_cast(pFVar1,&Format::typeinfo,&DummyFormat::typeinfo,0);
    }
    if (local_40 == 0) {
      return pFVar1;
    }
  }
  return (Format *)0x0;
}

Assistant:

Format* MessageFormat::getCachedFormatter(int32_t argumentNumber) const {
    if (cachedFormatters == NULL) {
        return NULL;
    }
    void* ptr = uhash_iget(cachedFormatters, argumentNumber);
    if (ptr != NULL && dynamic_cast<DummyFormat*>((Format*)ptr) == NULL) {
        return (Format*) ptr;
    } else {
        // Not cached, or a DummyFormat representing setFormat(NULL).
        return NULL;
    }
}